

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

string * __thiscall
pbrt::syntactic::Material::toString_abi_cxx11_(string *__return_storage_ptr__,Material *this)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  stringstream ss;
  string local_1d8 [32];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::operator<<(local_1a8,"Material type=\'");
  poVar1 = std::operator<<(poVar1,(string *)&this->type);
  poVar1 = std::operator<<(poVar1,"\' {");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (p_Var2 = (this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->super_ParamSet).param._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(local_1a8," - ");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1," : ");
    (**(code **)(**(long **)(p_Var2 + 2) + 0x10))(local_1d8);
    poVar1 = std::operator<<(poVar1,local_1d8);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string(local_1d8);
  }
  poVar1 = std::operator<<(local_1a8,"}");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string Material::toString() const
    {
      std::stringstream ss;
      ss << "Material type='"<< type << "' {" << std::endl;
      for (std::map<std::string,std::shared_ptr<Param> >::const_iterator it=param.begin(); 
           it != param.end(); it++) {
        ss << " - " << it->first << " : " << it->second->toString() << std::endl;
      }
      ss << "}" << std::endl;
      return ss.str();
    }